

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs.h
# Opt level: O0

void __thiscall BMRS<RemSP>::FirstScan(BMRS<RemSP> *this)

{
  int iVar1;
  int data_width_00;
  uint64_t *puVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  ulong local_b0;
  uint64_t d_shl;
  uint64_t d;
  uint64_t u_shl;
  uint64_t u;
  int j_2;
  uint64_t d0;
  uint64_t u0;
  uint64_t *bits_dest;
  uint64_t *bits_d;
  uint64_t *bits_u;
  int i_1;
  int j_1;
  uint64_t *pdata_merged_1;
  uint64_t *pdata_source;
  int j;
  uint64_t *pdata_merged;
  uint64_t *pdata_source2;
  uint64_t *pdata_source1;
  int i;
  int data_width;
  int h_merge;
  int h;
  int w;
  BMRS<RemSP> *this_local;
  
  iVar1 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  data_width_00 = (this->data_compressed).data_width;
  for (pdata_source1._4_4_ = 0; pdata_source1._4_4_ < iVar1 / 2;
      pdata_source1._4_4_ = pdata_source1._4_4_ + 1) {
    puVar2 = Data_Compressed::operator[](&this->data_compressed,(long)(pdata_source1._4_4_ << 1));
    puVar3 = Data_Compressed::operator[](&this->data_compressed,(long)(pdata_source1._4_4_ * 2 + 1))
    ;
    puVar4 = Data_Compressed::operator[](&this->data_merged,(long)pdata_source1._4_4_);
    for (pdata_source._4_4_ = 0; pdata_source._4_4_ < data_width_00;
        pdata_source._4_4_ = pdata_source._4_4_ + 1) {
      puVar4[pdata_source._4_4_] = puVar2[pdata_source._4_4_] | puVar3[pdata_source._4_4_];
    }
  }
  if (iVar1 % 2 != 0) {
    puVar2 = Data_Compressed::operator[](&this->data_compressed,(long)(iVar1 + -1));
    puVar3 = Data_Compressed::operator[](&this->data_merged,(long)(iVar1 / 2));
    for (bits_u._4_4_ = 0; bits_u._4_4_ < data_width_00; bits_u._4_4_ = bits_u._4_4_ + 1) {
      puVar3[bits_u._4_4_] = puVar2[bits_u._4_4_];
    }
  }
  for (bits_u._0_4_ = 0; (int)bits_u < (this->data_flags).height; bits_u._0_4_ = (int)bits_u + 1) {
    puVar2 = Data_Compressed::operator[](&this->data_compressed,(long)((int)bits_u * 2 + 1));
    puVar3 = Data_Compressed::operator[](&this->data_compressed,(long)((int)bits_u * 2 + 2));
    puVar4 = Data_Compressed::operator[](&this->data_flags,(long)(int)bits_u);
    *puVar4 = (*puVar2 | *puVar2 << 1) & (*puVar3 | *puVar3 << 1);
    for (u._4_4_ = 1; u._4_4_ < data_width_00; u._4_4_ = u._4_4_ + 1) {
      d = puVar2[u._4_4_] << 1;
      local_b0 = puVar3[u._4_4_] << 1;
      if ((puVar2[u._4_4_ + -1] & 0x8000000000000000) != 0) {
        d = d | 1;
      }
      if ((puVar3[u._4_4_ + -1] & 0x8000000000000000) != 0) {
        local_b0 = local_b0 | 1;
      }
      puVar4[u._4_4_] = (puVar2[u._4_4_] | d) & (puVar3[u._4_4_] | local_b0);
    }
  }
  RemSP::Setup();
  FindRuns(this,(this->data_merged).bits,(this->data_flags).bits,iVar1 / 2 + iVar1 % 2,data_width_00
           ,(this->data_runs).runs);
  return;
}

Assistant:

void FirstScan() {
        int w(img_.cols);
        int h(img_.rows);

        //generate merged data
        int h_merge = h / 2 + h % 2;
        int data_width = data_compressed.data_width;
        for (int i = 0; i < h / 2; i++) {
            uint64_t* pdata_source1 = data_compressed[2 * i];
            uint64_t* pdata_source2 = data_compressed[2 * i + 1];
            uint64_t* pdata_merged = data_merged[i];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source1[j] | pdata_source2[j];
        }
        if (h % 2) {
            uint64_t* pdata_source = data_compressed[h - 1];
            uint64_t* pdata_merged = data_merged[h / 2];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source[j];
        }

        //generate flag bits
        for (int i = 0; i < data_flags.height; i++) {
            uint64_t* bits_u = data_compressed[2 * i + 1];
            uint64_t* bits_d = data_compressed[2 * i + 2];
            uint64_t* bits_dest = data_flags[i];

            uint64_t u0 = bits_u[0];
            uint64_t d0 = bits_d[0];
            bits_dest[0] = (u0 | (u0 << 1)) & (d0 | (d0 << 1));
            for (int j = 1; j < data_width; j++) {
                uint64_t u = bits_u[j];
                uint64_t u_shl = u << 1;
                uint64_t d = bits_d[j];
                uint64_t d_shl = d << 1;
                if (bits_u[j - 1] & 0x8000000000000000) u_shl |= 1;
                if (bits_d[j - 1] & 0x8000000000000000) d_shl |= 1;
                bits_dest[j] = (u | u_shl) & (d | d_shl);
            }
        }

        LabelsSolver::Setup();
        FindRuns(data_merged.bits, data_flags.bits, h_merge, data_width, data_runs.runs);
    }